

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall extract_file::~extract_file(extract_file *this)

{
  extract_file *this_local;
  
  ~extract_file(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

virtual ~extract_file() { }